

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_set_sr_im(DisasContext_conflict2 *s,uint16_t val,int ccr_only)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg2;
  int32_t iVar1;
  TCGv_i32 sr;
  TCGContext_conflict2 *tcg_ctx;
  int ccr_only_local;
  uint16_t val_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (ccr_only == 0) {
    arg2 = tcg_const_i32_m68k(tcg_ctx_00,(uint)val);
    gen_helper_set_sr(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
    tcg_temp_free_i32(tcg_ctx_00,arg2);
  }
  else {
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_C,(uint)((val & 1) != 0));
    iVar1 = 0;
    if ((val & 2) != 0) {
      iVar1 = -1;
    }
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_V,iVar1);
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_Z,(uint)((val & 4) == 0));
    iVar1 = 0;
    if ((val & 8) != 0) {
      iVar1 = -1;
    }
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_N,iVar1);
    tcg_gen_movi_i32(tcg_ctx_00,QREG_CC_X,(uint)((val & 0x10) != 0));
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void gen_set_sr_im(DisasContext *s, uint16_t val, int ccr_only)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (ccr_only) {
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, val & CCF_C ? 1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, val & CCF_V ? -1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_Z, val & CCF_Z ? 0 : 1);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_N, val & CCF_N ? -1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_X, val & CCF_X ? 1 : 0);
    } else {
        TCGv sr = tcg_const_i32(tcg_ctx, val);
        gen_helper_set_sr(tcg_ctx, tcg_ctx->cpu_env, sr);
        tcg_temp_free(tcg_ctx, sr);
    }
    set_cc_op(s, CC_OP_FLAGS);
}